

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

bool CorUnix::CPalSynchronizationManager::InterlockedAwaken(DWORD *pWaitState,bool fAlertOnly)

{
  bool bVar1;
  
  LOCK();
  bVar1 = *pWaitState == 2;
  if (bVar1) {
    *pWaitState = 0;
  }
  UNLOCK();
  if (!fAlertOnly && !bVar1) {
    LOCK();
    bVar1 = *pWaitState == 1;
    if (bVar1) {
      *pWaitState = 0;
    }
    UNLOCK();
  }
  return bVar1;
}

Assistant:

bool CPalSynchronizationManager::InterlockedAwaken(
        DWORD *pWaitState,
        bool fAlertOnly)
    {
        DWORD dwPrevState;

        dwPrevState = InterlockedCompareExchange((LONG *)pWaitState,
                                                 TWS_ACTIVE, TWS_ALERTABLE);
        if(TWS_ALERTABLE != dwPrevState)
        {
            if(fAlertOnly)
            {
                return false;
            }

            dwPrevState = InterlockedCompareExchange((LONG *)pWaitState,
                                                     TWS_ACTIVE, TWS_WAITING);
            if(TWS_WAITING == dwPrevState)
            {
                return true;
            }
        }
        else
        {
            return true;
        }
        return false;
    }